

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O1

string * __thiscall Apt::GetRwysString_abi_cxx11_(string *__return_storage_ptr__,Apt *this)

{
  pointer pRVar1;
  pointer pRVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pRVar1 = (this->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar1 != (this->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>._M_impl
                .super__Vector_impl_data._M_finish) {
    pRVar1 = pRVar1 + 1;
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)pRVar1[-1].id._M_dataplus._M_p);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      if (pRVar1 != (this->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(pRVar1->id)._M_dataplus._M_p);
      }
      pRVar2 = pRVar1 + 1;
      pRVar1 = pRVar1 + 2;
    } while (pRVar2 != (this->vecRwyEndPts).super__Vector_base<RwyEndPt,_std::allocator<RwyEndPt>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetRwysString () const
    {
        std::string s;
        // loop all runways (the two ends of a rwy are always added together to the vector)
        for (vecRwyEndPtTy::const_iterator i = vecRwyEndPts.cbegin();
             i != vecRwyEndPts.cend();
             ++i)
        {
            if (!s.empty()) s += " / ";     // divider between runways
            s += i->id;                     // add ids of runways
            s += '-';
            if ((++i) != vecRwyEndPts.cend())
                s += i->id;
        }
        return s;
    }